

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_vproc.cpp
# Opt level: O0

void dump_mppbuffer(MppBuffer buf,char *fname,int stride,int height)

{
  void *__ptr;
  FILE *__s;
  FILE *dump;
  void *ptr;
  char title [256];
  int height_local;
  int stride_local;
  char *fname_local;
  MppBuffer buf_local;
  
  __ptr = mpp_buffer_get_ptr_with_caller(buf,"dump_mppbuffer");
  sprintf((char *)&ptr,"%s.%dx%d.yuv",fname,(ulong)(uint)stride,(ulong)(uint)height);
  __s = fopen((char *)&ptr,"ab+");
  if (__s != (FILE *)0x0) {
    fwrite(__ptr,1,(long)((stride * height * 3) / 2),__s);
    fclose(__s);
  }
  return;
}

Assistant:

static void dump_mppbuffer(MppBuffer buf, const char *fname, int stride, int height)
{
    char title[256];
    void *ptr = mpp_buffer_get_ptr(buf);
    sprintf(title, "%s.%dx%d.yuv", fname, stride, height);
    FILE *dump = fopen(title, "ab+");

    if (dump) {
        fwrite(ptr, 1, stride * height * 3 / 2, dump);
        fclose(dump);
    }
}